

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  Classifier CVar2;
  char *pcVar3;
  undefined1 *puVar4;
  Option *pOVar5;
  ulong uVar6;
  App *this_00;
  string local_108;
  Classifier local_e4;
  undefined1 local_e0 [4];
  Classifier res;
  App *local_c0;
  App *cm;
  size_type dotloc;
  long local_a8;
  undefined8 local_a0;
  string local_98;
  undefined4 local_78;
  undefined1 local_68 [8];
  string dummy2;
  string dummy1;
  bool ignore_used_subcommands_local;
  string *current_local;
  App *this_local;
  
  ::std::__cxx11::string::string((string *)(dummy2.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_68);
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    this_local._4_4_ = POSITIONAL_MARK;
  }
  else {
    bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
    if (bVar1) {
      this_local._4_4_ = SUBCOMMAND;
    }
    else {
      bVar1 = detail::split_long(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68);
      if (bVar1) {
        this_local._4_4_ = LONG;
      }
      else {
        bVar1 = detail::split_short(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68
                                   );
        if (bVar1) {
          pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&dummy2.field_2 + 8));
          if ((('/' < *pcVar3) &&
              (pcVar3 = (char *)::std::__cxx11::string::operator[]
                                          ((ulong)((long)&dummy2.field_2 + 8)), *pcVar3 < ':')) ||
             (((pcVar3 = (char *)::std::__cxx11::string::operator[]
                                           ((ulong)((long)&dummy2.field_2 + 8)), *pcVar3 == '.' &&
               ((uVar6 = ::std::__cxx11::string::empty(), (uVar6 & 1) == 0 &&
                (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_68), '/' < *pcVar3
                )))) && (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_68),
                        *pcVar3 < ':')))) {
            dotloc._6_1_ = 0x2d;
            puVar4 = (undefined1 *)
                     ::std::__cxx11::string::operator[]((ulong)((long)&dummy2.field_2 + 8));
            dotloc._7_1_ = *puVar4;
            local_a8 = (long)&dotloc + 6;
            local_a0 = 2;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_98,local_a8,local_a0,(long)&dotloc + 5);
            pOVar5 = get_option_no_throw(this,&local_98);
            ::std::__cxx11::string::~string((string *)&local_98);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&dotloc + 5));
            if (pOVar5 == (Option *)0x0) {
              this_local._4_4_ = NONE;
              goto LAB_0015d820;
            }
          }
          this_local._4_4_ = SHORT;
        }
        else if (((this->allow_windows_style_options_ & 1U) == 0) ||
                (bVar1 = detail::split_windows_style
                                   (current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68
                                   ), !bVar1)) {
          bVar1 = ::std::operator==(current,"++");
          if (((bVar1) && (uVar6 = ::std::__cxx11::string::empty(), (uVar6 & 1) == 0)) &&
             (this->parent_ != (App *)0x0)) {
            this_local._4_4_ = SUBCOMMAND_TERMINATOR;
          }
          else {
            cm = (App *)::std::__cxx11::string::find_first_of((char)current,0x2e);
            if (cm != (App *)0xffffffffffffffff) {
              ::std::__cxx11::string::substr((ulong)local_e0,(ulong)current);
              this_00 = _find_subcommand(this,(string *)local_e0,true,ignore_used_subcommands);
              ::std::__cxx11::string::~string((string *)local_e0);
              local_c0 = this_00;
              if (this_00 != (App *)0x0) {
                ::std::__cxx11::string::substr((ulong)&local_108,(ulong)current);
                CVar2 = _recognize(this_00,&local_108,ignore_used_subcommands);
                ::std::__cxx11::string::~string((string *)&local_108);
                local_e4 = CVar2;
                if (CVar2 == SUBCOMMAND) {
                  this_local._4_4_ = SUBCOMMAND;
                  goto LAB_0015d820;
                }
              }
            }
            this_local._4_4_ = NONE;
          }
        }
        else {
          this_local._4_4_ = WINDOWS_STYLE;
        }
      }
    }
  }
LAB_0015d820:
  local_78 = 1;
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::__cxx11::string::~string((string *)(dummy2.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}